

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_math_test_mult.cpp
# Opt level: O2

void mult_test(void)

{
  ostream *poVar1;
  
  test_base<unsigned_long,unsigned_int,bool(*)(unsigned_long,unsigned_int,unsigned_long*),unsigned_long(*)(unsigned_long,unsigned_int),0>
            ("uint64_uint32",check_mul_uint64_uint32,safe_mul_uint64_uint32);
  test_base<unsigned_long,int,bool(*)(unsigned_long,int,unsigned_long*),unsigned_long(*)(unsigned_long,int),0>
            ("uint64_int32",check_mul_uint64_int32,safe_mul_uint64_int32);
  test_base<long,unsigned_int,bool(*)(long,unsigned_int,long*),long(*)(long,unsigned_int),0>
            ("int64_uint32",check_mul_int64_uint32,safe_mul_int64_uint32);
  test_base<long,int,bool(*)(long,int,long*),long(*)(long,int),0>
            ("int64_int32",check_mul_int64_int32,safe_mul_int64_int32);
  test_base<unsigned_int,unsigned_int,bool(*)(unsigned_int,unsigned_int,unsigned_int*),unsigned_int(*)(unsigned_int,unsigned_int),0>
            ("uint32_uint32",check_mul_uint32_uint32,safe_mul_uint32_uint32);
  test_base<unsigned_int,int,bool(*)(unsigned_int,int,unsigned_int*),unsigned_int(*)(unsigned_int,int),0>
            ("uint32_int32",check_mul_uint32_int32,safe_mul_uint32_int32);
  test_base<int,unsigned_int,bool(*)(int,unsigned_int,int*),int(*)(int,unsigned_int),0>
            ("int32_uint32",check_mul_int32_uint32,safe_mul_int32_uint32);
  test_base<int,int,bool(*)(int,int,int*),int(*)(int,int),0>
            ("int32_int32",check_mul_int32_int32,safe_mul_int32_int32);
  poVar1 = std::operator<<((ostream *)&std::cout,"Multiplication tests completed");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void mult_test()
{
	try
	{
		mult_test_uint64_uint64();
		mult_test_uint64_uint32();
		mult_test_uint64_int64();
		mult_test_uint64_int32();

		mult_test_int64_uint64();
		mult_test_int64_uint32();
		mult_test_int64_int64();
		mult_test_int64_int32();

		mult_test_uint32_uint64();
		mult_test_uint32_uint32();
		mult_test_uint32_int64();
		mult_test_uint32_int32();

		mult_test_int32_uint64();
		mult_test_int32_uint32();
		mult_test_int32_int64();
		mult_test_int32_int32();

		std::cout << "Multiplication tests completed" << std::endl;
	}
	catch (std::exception& err)
	{
		std::cout << "Multiplication tests failed - " << err.what() << std::endl;
	}

	return;
}